

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CropResizeLayerParams::ByteSizeLong(CropResizeLayerParams *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  float fVar5;
  int cached_size;
  uint32_t raw_spatialscale;
  float tmp_spatialscale;
  int cached_size_1;
  size_t data_size;
  size_t sStack_30;
  uint32_t cached_has_bits;
  size_t total_size;
  CropResizeLayerParams *this_local;
  memory_order __b;
  
  sStack_30 = 0;
  sVar3 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->targetsize_);
  if (sVar3 != 0) {
    sStack_30 = google::protobuf::internal::WireFormatLite::Int32Size((int32_t)sVar3);
    sStack_30 = sStack_30 + 1;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sVar3);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->_targetsize_cached_byte_size_).super___atomic_base<int>._M_i = iVar2;
  sStack_30 = sVar3 + sStack_30;
  bVar1 = _internal_has_mode(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::SamplingMode>(this->mode_);
    sStack_30 = sVar3 + 1 + sStack_30;
  }
  bVar1 = _internal_has_boxindicesmode(this);
  if (bVar1) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::BoxCoordinatesMode>(this->boxindicesmode_);
    sStack_30 = sVar3 + 1 + sStack_30;
  }
  bVar1 = _internal_normalizedcoordinates(this);
  if (bVar1) {
    sStack_30 = sStack_30 + 2;
  }
  fVar5 = _internal_spatialscale(this);
  if (fVar5 != 0.0) {
    sStack_30 = sStack_30 + 5;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar4 = std::__cxx11::string::size();
    sStack_30 = lVar4 + sStack_30;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_30);
  SetCachedSize(this,iVar2);
  return sStack_30;
}

Assistant:

size_t CropResizeLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CropResizeLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated uint64 targetSize = 1;
  {
    size_t data_size = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      UInt64Size(this->targetsize_);
    if (data_size > 0) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
            static_cast<int32_t>(data_size));
    }
    int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(data_size);
    _targetsize_cached_byte_size_.store(cached_size,
                                    std::memory_order_relaxed);
    total_size += data_size;
  }

  // .CoreML.Specification.SamplingMode mode = 3;
  if (this->_internal_has_mode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *mode_);
  }

  // .CoreML.Specification.BoxCoordinatesMode boxIndicesMode = 4;
  if (this->_internal_has_boxindicesmode()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
        *boxindicesmode_);
  }

  // bool normalizedCoordinates = 2;
  if (this->_internal_normalizedcoordinates() != 0) {
    total_size += 1 + 1;
  }

  // float spatialScale = 5;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_spatialscale = this->_internal_spatialscale();
  uint32_t raw_spatialscale;
  memcpy(&raw_spatialscale, &tmp_spatialscale, sizeof(tmp_spatialscale));
  if (raw_spatialscale != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}